

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trees.c
# Opt level: O1

void send_tree(deflate_state *s,ct_data *tree,int max_code)

{
  Bytef BVar1;
  ushort uVar2;
  ushort uVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  ulong uVar7;
  uint uVar8;
  uint uVar9;
  ulong uVar10;
  ulong uVar11;
  ushort uVar12;
  int iVar13;
  ushort uVar14;
  
  if (-1 < max_code) {
    uVar2 = (tree->dl).dad;
    uVar4 = 7;
    if (uVar2 == 0) {
      uVar4 = 0x8a;
    }
    iVar5 = (uVar2 != 0) + 3;
    uVar10 = 0;
    uVar7 = 0xffffffff;
    iVar13 = 0;
    uVar8 = (uint)uVar2;
    do {
      uVar11 = (ulong)uVar8;
      uVar2 = tree[uVar10 + 1].dl.dad;
      uVar9 = (uint)uVar2;
      iVar6 = iVar13 + 1;
      if (((int)uVar4 <= iVar6) || (uVar8 != uVar9)) {
        if (iVar6 < iVar5) {
          do {
            uVar12 = s->bl_tree[uVar11].dl.dad;
            iVar5 = s->bi_valid;
            uVar3 = s->bl_tree[uVar11].fc.freq;
            uVar14 = uVar3 << ((byte)iVar5 & 0x1f);
            if ((int)(0x10 - (uint)uVar12) < iVar5) {
              uVar14 = uVar14 | s->bi_buf;
              s->bi_buf = uVar14;
              uVar4 = s->pending;
              s->pending = uVar4 + 1;
              s->pending_buf[uVar4] = (Bytef)uVar14;
              BVar1 = *(Bytef *)((long)&s->bi_buf + 1);
              uVar4 = s->pending;
              s->pending = uVar4 + 1;
              s->pending_buf[uVar4] = BVar1;
              s->bi_buf = uVar3 >> (0x10U - (char)s->bi_valid & 0x1f);
              iVar5 = (uint)uVar12 + s->bi_valid + -0x10;
            }
            else {
              s->bi_buf = s->bi_buf | uVar14;
              iVar5 = iVar5 + (uint)uVar12;
            }
            s->bi_valid = iVar5;
            iVar6 = iVar6 + -1;
          } while (iVar6 != 0);
        }
        else {
          if (uVar8 == 0) {
            if (iVar13 < 10) {
              uVar12 = s->bl_tree[0x11].dl.dad;
              iVar5 = s->bi_valid;
              uVar3 = s->bl_tree[0x11].fc.freq;
              uVar14 = uVar3 << ((byte)iVar5 & 0x1f);
              if ((int)(0x10 - (uint)uVar12) < iVar5) {
                uVar14 = uVar14 | s->bi_buf;
                s->bi_buf = uVar14;
                uVar4 = s->pending;
                s->pending = uVar4 + 1;
                s->pending_buf[uVar4] = (Bytef)uVar14;
                BVar1 = *(Bytef *)((long)&s->bi_buf + 1);
                uVar4 = s->pending;
                s->pending = uVar4 + 1;
                s->pending_buf[uVar4] = BVar1;
                s->bi_buf = uVar3 >> (0x10U - (char)s->bi_valid & 0x1f);
                iVar5 = s->bi_valid + (uint)uVar12 + -0x10;
              }
              else {
                s->bi_buf = s->bi_buf | uVar14;
                iVar5 = iVar5 + (uint)uVar12;
              }
              s->bi_valid = iVar5;
              if (iVar5 < 0xe) {
                s->bi_buf = s->bi_buf | (ushort)(iVar13 + 0xfffe << ((byte)iVar5 & 0x1f));
                iVar5 = iVar5 + 3;
              }
              else {
                uVar12 = (ushort)(iVar13 - 2U << ((byte)iVar5 & 0x1f)) | s->bi_buf;
                s->bi_buf = uVar12;
                uVar4 = s->pending;
                s->pending = uVar4 + 1;
                s->pending_buf[uVar4] = (Bytef)uVar12;
                BVar1 = *(Bytef *)((long)&s->bi_buf + 1);
                uVar4 = s->pending;
                s->pending = uVar4 + 1;
                s->pending_buf[uVar4] = BVar1;
                s->bi_buf = (ush)((iVar13 - 2U & 0xffff) >> (0x10U - (char)s->bi_valid & 0x1f));
                iVar5 = s->bi_valid + -0xd;
              }
            }
            else {
              uVar12 = s->bl_tree[0x12].dl.dad;
              iVar5 = s->bi_valid;
              uVar3 = s->bl_tree[0x12].fc.freq;
              uVar14 = uVar3 << ((byte)iVar5 & 0x1f);
              if ((int)(0x10 - (uint)uVar12) < iVar5) {
                uVar14 = uVar14 | s->bi_buf;
                s->bi_buf = uVar14;
                uVar4 = s->pending;
                s->pending = uVar4 + 1;
                s->pending_buf[uVar4] = (Bytef)uVar14;
                BVar1 = *(Bytef *)((long)&s->bi_buf + 1);
                uVar4 = s->pending;
                s->pending = uVar4 + 1;
                s->pending_buf[uVar4] = BVar1;
                s->bi_buf = uVar3 >> (0x10U - (char)s->bi_valid & 0x1f);
                iVar5 = s->bi_valid + (uint)uVar12 + -0x10;
              }
              else {
                s->bi_buf = s->bi_buf | uVar14;
                iVar5 = iVar5 + (uint)uVar12;
              }
              s->bi_valid = iVar5;
              if (iVar5 < 10) {
                s->bi_buf = s->bi_buf | (ushort)(iVar13 + 0xfff6 << ((byte)iVar5 & 0x1f));
                iVar5 = iVar5 + 7;
              }
              else {
                uVar12 = (ushort)(iVar13 - 10U << ((byte)iVar5 & 0x1f)) | s->bi_buf;
                s->bi_buf = uVar12;
                uVar4 = s->pending;
                s->pending = uVar4 + 1;
                s->pending_buf[uVar4] = (Bytef)uVar12;
                BVar1 = *(Bytef *)((long)&s->bi_buf + 1);
                uVar4 = s->pending;
                s->pending = uVar4 + 1;
                s->pending_buf[uVar4] = BVar1;
                s->bi_buf = (ush)((iVar13 - 10U & 0xffff) >> (0x10U - (char)s->bi_valid & 0x1f));
                iVar5 = s->bi_valid + -9;
              }
            }
          }
          else {
            if (uVar8 != (uint)uVar7) {
              uVar12 = s->bl_tree[uVar11].dl.dad;
              iVar5 = s->bi_valid;
              uVar3 = s->bl_tree[uVar11].fc.freq;
              uVar14 = uVar3 << ((byte)iVar5 & 0x1f);
              if ((int)(0x10 - (uint)uVar12) < iVar5) {
                uVar14 = uVar14 | s->bi_buf;
                s->bi_buf = uVar14;
                uVar4 = s->pending;
                s->pending = uVar4 + 1;
                s->pending_buf[uVar4] = (Bytef)uVar14;
                BVar1 = *(Bytef *)((long)&s->bi_buf + 1);
                uVar4 = s->pending;
                s->pending = uVar4 + 1;
                s->pending_buf[uVar4] = BVar1;
                s->bi_buf = uVar3 >> (0x10U - (char)s->bi_valid & 0x1f);
                iVar5 = (uint)uVar12 + s->bi_valid + -0x10;
              }
              else {
                s->bi_buf = s->bi_buf | uVar14;
                iVar5 = iVar5 + (uint)uVar12;
              }
              s->bi_valid = iVar5;
              iVar6 = iVar13;
            }
            uVar12 = s->bl_tree[0x10].dl.dad;
            iVar5 = s->bi_valid;
            uVar3 = s->bl_tree[0x10].fc.freq;
            uVar14 = uVar3 << ((byte)iVar5 & 0x1f);
            if ((int)(0x10 - (uint)uVar12) < iVar5) {
              uVar14 = uVar14 | s->bi_buf;
              s->bi_buf = uVar14;
              uVar4 = s->pending;
              s->pending = uVar4 + 1;
              s->pending_buf[uVar4] = (Bytef)uVar14;
              BVar1 = *(Bytef *)((long)&s->bi_buf + 1);
              uVar4 = s->pending;
              s->pending = uVar4 + 1;
              s->pending_buf[uVar4] = BVar1;
              s->bi_buf = uVar3 >> (0x10U - (char)s->bi_valid & 0x1f);
              iVar5 = s->bi_valid + (uint)uVar12 + -0x10;
            }
            else {
              s->bi_buf = s->bi_buf | uVar14;
              iVar5 = iVar5 + (uint)uVar12;
            }
            s->bi_valid = iVar5;
            if (iVar5 < 0xf) {
              s->bi_buf = s->bi_buf | (ushort)(iVar6 + 0xfffd << ((byte)iVar5 & 0x1f));
              iVar5 = iVar5 + 2;
            }
            else {
              uVar12 = (ushort)(iVar6 - 3U << ((byte)iVar5 & 0x1f)) | s->bi_buf;
              s->bi_buf = uVar12;
              uVar4 = s->pending;
              s->pending = uVar4 + 1;
              s->pending_buf[uVar4] = (Bytef)uVar12;
              BVar1 = *(Bytef *)((long)&s->bi_buf + 1);
              uVar4 = s->pending;
              s->pending = uVar4 + 1;
              s->pending_buf[uVar4] = BVar1;
              s->bi_buf = (ush)((iVar6 - 3U & 0xffff) >> (0x10U - (char)s->bi_valid & 0x1f));
              iVar5 = s->bi_valid + -0xe;
            }
          }
          s->bi_valid = iVar5;
        }
        uVar7 = uVar11;
        iVar6 = 0;
        if (uVar2 == 0) {
          uVar4 = 0x8a;
          iVar5 = 3;
        }
        else {
          iVar5 = 4 - (uint)(uVar8 == uVar9);
          uVar4 = uVar8 == uVar9 ^ 7;
        }
      }
      iVar13 = iVar6;
      uVar10 = uVar10 + 1;
      uVar8 = uVar9;
    } while (uVar10 != max_code + 1);
  }
  return;
}

Assistant:

local void send_tree (s, tree, max_code)
    deflate_state *s;
    ct_data *tree; /* the tree to be scanned */
    int max_code;       /* and its largest code of non zero frequency */
{
    int n;                     /* iterates over all tree elements */
    int prevlen = -1;          /* last emitted length */
    int curlen;                /* length of current code */
    int nextlen = tree[0].Len; /* length of next code */
    int count = 0;             /* repeat count of the current code */
    int max_count = 7;         /* max repeat count */
    int min_count = 4;         /* min repeat count */

    /* tree[max_code+1].Len = -1; */  /* guard already set */
    if (nextlen == 0) max_count = 138, min_count = 3;

    for (n = 0; n <= max_code; n++) {
        curlen = nextlen; nextlen = tree[n+1].Len;
        if (++count < max_count && curlen == nextlen) {
            continue;
        } else if (count < min_count) {
            do { send_code(s, curlen, s->bl_tree); } while (--count != 0);

        } else if (curlen != 0) {
            if (curlen != prevlen) {
                send_code(s, curlen, s->bl_tree); count--;
            }
            Assert(count >= 3 && count <= 6, " 3_6?");
            send_code(s, REP_3_6, s->bl_tree); send_bits(s, count-3, 2);

        } else if (count <= 10) {
            send_code(s, REPZ_3_10, s->bl_tree); send_bits(s, count-3, 3);

        } else {
            send_code(s, REPZ_11_138, s->bl_tree); send_bits(s, count-11, 7);
        }
        count = 0; prevlen = curlen;
        if (nextlen == 0) {
            max_count = 138, min_count = 3;
        } else if (curlen == nextlen) {
            max_count = 6, min_count = 3;
        } else {
            max_count = 7, min_count = 4;
        }
    }
}